

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O2

void * mpp_dec_advanced_thread(void *data)

{
  HalTaskInfo *task_00;
  MppDecImpl *dec;
  MppThread *this;
  MppBufSlots slots;
  MppBufSlots slots_00;
  MppPort port;
  MppPort port_00;
  pthread_mutex_t *__mutex;
  MppThreadStatus MVar1;
  MPP_RET MVar2;
  RK_U32 RVar3;
  MppFrameFormat v;
  MppMeta pvVar4;
  MppFrame pvVar5;
  MppBuffer pvVar6;
  MppBuffer buffer;
  size_t sVar7;
  size_t sVar8;
  RK_S64 RVar9;
  SlotUsageType type;
  MppBufSlots slots_01;
  uint uVar10;
  undefined4 uVar11;
  MppFrame frame;
  MppTask mpp_task;
  MppPacket packet;
  AutoMutex autolock;
  DecTask task;
  
  dec = *(MppDecImpl **)((long)data + 0xa8);
  this = dec->thread_parser;
  slots = dec->frame_slots;
  slots_00 = dec->packet_slots;
  dec_task_init(&task);
  port = *(MppPort *)((long)data + 0x60);
  port_00 = *(MppPort *)((long)data + 0x68);
  mpp_task = (MppTask)0x0;
  frame = (MppFrame)0x0;
  packet = (MppPacket)0x0;
LAB_00147283:
  do {
    while( true ) {
      autolock.mEnabled = 1;
      autolock.mLock = &this->mMutexCond[0].mLock;
      pthread_mutex_lock((pthread_mutex_t *)this->mMutexCond);
      MVar1 = MppThread::get_status(this,THREAD_WORK);
      if (MVar1 != MPP_THREAD_RUNNING) {
        Mutex::Autolock::~Autolock(&autolock);
        dec_release_task_in_port(port);
        dec_release_task_in_port(*(MppPort *)((long)data + 0x50));
        dec_release_task_in_port(*(MppPort *)((long)data + 0x58));
        return (void *)0x0;
      }
      MVar2 = check_task_wait(dec,&task);
      if (MVar2 != MPP_OK) {
        MppThread::wait(this,(void *)0x0);
      }
      Mutex::Autolock::~Autolock(&autolock);
      if (dec->cmd_send == dec->cmd_recv) break;
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_advanced_thread",
                   (ulong)dec->cmd_recv,(ulong)dec->cmd);
      }
      sem_wait((sem_t *)&dec->cmd_start);
      MVar2 = mpp_dec_proc_cfg(dec,dec->cmd,dec->param);
      *dec->cmd_ret = MVar2;
      uVar10 = dec->cmd_recv + 1;
      dec->cmd_recv = uVar10;
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_advanced_thread",(ulong)uVar10
                   ,(ulong)dec->cmd_send);
      }
      dec->cmd = 0;
      dec->param = (void *)0x0;
      dec->cmd_ret = (MPP_RET *)0x0;
      sem_post((sem_t *)&dec->cmd_done);
    }
    if ((mpp_dec_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_dec","mpp_pkt_in_rdy %d\n","mpp_dec_advanced_thread",
                 (ulong)(task.status.val >> 1 & 1));
    }
    if ((task.status.val & 2) == 0) {
      MVar2 = _mpp_port_poll("mpp_dec_advanced_thread",port,MPP_POLL_NON_BLOCK);
      if (MVar2 < MPP_OK) {
        task.wait.val._0_1_ = task.wait.val._0_1_ | 1;
        goto LAB_00147283;
      }
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","poll ready\n","mpp_dec_advanced_thread");
      }
      task.status.val = task.status.val | 2;
      task.wait.val._0_1_ = task.wait.val._0_1_ & 0xfe;
      MVar2 = _mpp_port_dequeue("mpp_dec_advanced_thread",port,&mpp_task);
      if ((MVar2 != MPP_OK) &&
         (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                     "mpp_dec_advanced_thread",0x3cd), (mpp_debug._3_1_ & 0x10) != 0))
      goto LAB_00147be3;
    }
    if ((mpp_dec_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_dec","task in ready\n","mpp_dec_advanced_thread");
    }
    if ((mpp_task == (MppTask)0x0) &&
       (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"mpp_task",
                   "mpp_dec_advanced_thread",0x3d1), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00147be3:
      abort();
    }
    mpp_task_meta_get_packet(mpp_task,KEY_INPUT_PACKET,&packet);
    mpp_task_meta_get_frame(mpp_task,KEY_OUTPUT_FRAME,&frame);
    pvVar5 = frame;
    if ((packet != (MppPacket)0x0 && frame == (MppFrame)0x0) &&
       (pvVar4 = mpp_packet_get_meta(packet), pvVar5 = frame, pvVar4 != (MppMeta)0x0)) {
      mpp_meta_get_frame(pvVar4,KEY_OUTPUT_FRAME,&frame);
      if (frame == (MppFrame)0x0) {
        pvVar5 = (MppFrame)0x0;
      }
      else {
        task.status.val = task.status.val | 0x400;
        pvVar5 = frame;
      }
    }
    if ((packet == (MppPacket)0x0) || (pvVar5 == (MppFrame)0x0)) {
      _mpp_port_enqueue("mpp_dec_advanced_thread",port,mpp_task);
      task.status.val = task.status.val & 0xfffffffd;
    }
    else {
      pvVar6 = mpp_packet_get_buffer(packet);
      if (pvVar6 == (MppBuffer)0x0) {
        _mpp_log_l(4,"mpp_dec","line(%d): Error! Get no buffer from input packet\n",
                   "mpp_dec_advanced_thread",0x43d);
        mpp_frame_init(&frame);
        mpp_frame_set_errinfo(frame,1);
      }
      else {
        pvVar6 = mpp_packet_get_buffer(packet);
        buffer = mpp_frame_get_buffer(frame);
        mpp_parser_prepare(dec->parser,packet,&task.info.dec);
        if (((task.info._8_1_ & 1) == 0) || (task.info.dec.valid != 0)) {
          if (task.info.dec.input < 0) {
            mpp_buf_slot_get_unused(slots_00,&task.info.dec.input);
          }
          type = SLOT_HAL_INPUT;
          mpp_buf_slot_set_prop(slots_00,task.info.dec.input,SLOT_BUFFER,pvVar6);
          mpp_buf_slot_set_flag(slots_00,task.info.dec.input,SLOT_CODEC_READY);
          mpp_buf_slot_set_flag(slots_00,task.info.dec.input,SLOT_HAL_INPUT);
          MVar2 = mpp_parser_parse(dec->parser,&task.info.dec);
          if (MVar2 == MPP_OK) {
            if ((mpp_dec_debug & 0x20) != 0) {
              RVar3 = mpp_buf_slot_is_changed(slots);
              _mpp_log_l(4,"mpp_dec","slot change %d\n","mpp_dec_advanced_thread",(ulong)RVar3);
            }
            RVar3 = mpp_buf_slot_is_changed(slots);
            if (RVar3 != 0) {
              sVar7 = mpp_buf_slot_get_size(slots);
              sVar8 = mpp_buffer_get_size_with_caller(buffer,"mpp_dec_advanced_thread");
              if ((mpp_dec_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_dec","change size required %d vs input %d\n",
                           "mpp_dec_advanced_thread",sVar7,sVar8);
              }
              if (sVar7 == sVar8) {
                mpp_buf_slot_ready(slots);
              }
              if (sVar8 < sVar7) {
                uVar11 = 0x415;
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "slot_size <= buffer_size","mpp_dec_advanced_thread",0x415);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147be3;
                _mpp_log_l(2,"mpp_dec",
                           "required buffer size %d is larger than input buffer size %d\n",
                           "mpp_dec_advanced_thread",sVar7,sVar8,uVar11);
              }
            }
            mpp_buf_slot_set_prop(slots,task.info.dec.output,SLOT_BUFFER,buffer);
            if ((dec->info_updated == 0) && (dec->dev != (MppDev)0x0)) {
              autolock.mEnabled = 0;
              autolock._4_4_ = 0;
              mpp_buf_slot_get_prop(slots,task.info.dec.output,SLOT_FRAME_PTR,&autolock);
              update_dec_hal_info(dec,(MppFrame)autolock._0_8_);
              dec->info_updated = 1;
            }
            task_00 = &task.info;
            mpp_hal_reg_gen(dec->hal,task_00);
            mpp_hal_hw_start(dec->hal,task_00);
            mpp_hal_hw_wait(dec->hal,task_00);
            autolock.mEnabled = 0;
            autolock._4_4_ = 0;
            type = SLOT_HAL_OUTPUT;
            mpp_buf_slot_get_prop(slots,task.info.dec.output,SLOT_FRAME_PTR,&autolock);
            pvVar5 = frame;
            RVar3 = mpp_frame_get_width((MppFrame)autolock._0_8_);
            mpp_frame_set_width(pvVar5,RVar3);
            pvVar5 = frame;
            RVar3 = mpp_frame_get_height((MppFrame)autolock._0_8_);
            mpp_frame_set_height(pvVar5,RVar3);
            pvVar5 = frame;
            RVar3 = mpp_frame_get_hor_stride((MppFrame)autolock._0_8_);
            mpp_frame_set_hor_stride(pvVar5,RVar3);
            pvVar5 = frame;
            RVar3 = mpp_frame_get_ver_stride((MppFrame)autolock._0_8_);
            mpp_frame_set_ver_stride(pvVar5,RVar3);
            pvVar5 = frame;
            RVar3 = mpp_frame_get_hor_stride_pixel((MppFrame)autolock._0_8_);
            mpp_frame_set_hor_stride_pixel(pvVar5,RVar3);
            pvVar5 = frame;
            RVar9 = mpp_frame_get_pts((MppFrame)autolock._0_8_);
            mpp_frame_set_pts(pvVar5,RVar9);
            pvVar5 = frame;
            v = mpp_frame_get_fmt((MppFrame)autolock._0_8_);
            mpp_frame_set_fmt(pvVar5,v);
            pvVar5 = frame;
            RVar3 = mpp_frame_get_errinfo((MppFrame)autolock._0_8_);
            mpp_frame_set_errinfo(pvVar5,RVar3);
            pvVar5 = frame;
            sVar7 = mpp_frame_get_buf_size((MppFrame)autolock._0_8_);
            mpp_frame_set_buf_size(pvVar5,sVar7);
            mpp_buf_slot_clr_flag(slots_00,task.info.dec.input,SLOT_HAL_INPUT);
            slots_01 = slots;
            uVar11 = task.info.dec.output;
          }
          else {
            _mpp_log_l(2,"mpp_dec","something wrong with mpp_parser_parse!\n",
                       "mpp_dec_advanced_thread");
            mpp_frame_set_errinfo(frame,1);
            slots_01 = slots_00;
            uVar11 = task.info.dec.input;
          }
          mpp_buf_slot_clr_flag(slots_01,uVar11,type);
        }
        else {
          mpp_frame_set_eos(frame,1);
        }
      }
      if ((task.status.val & 0x400) == 0) {
        mpp_task_meta_set_packet(mpp_task,KEY_INPUT_PACKET,packet);
        _mpp_port_enqueue("mpp_dec_advanced_thread",port,mpp_task);
        mpp_task = (MppTask)0x0;
        _mpp_port_poll("mpp_dec_advanced_thread",port_00,MPP_POLL_BLOCK);
        _mpp_port_dequeue("mpp_dec_advanced_thread",port_00,&mpp_task);
        mpp_task_meta_set_frame(mpp_task,KEY_OUTPUT_FRAME,frame);
        pvVar6 = mpp_frame_get_buffer(frame);
        mpp_buffer_sync_begin_f(pvVar6,1,"mpp_dec_advanced_thread");
        _mpp_port_enqueue("mpp_dec_advanced_thread",port_00,mpp_task);
      }
      else {
        __mutex = *(pthread_mutex_t **)((long)data + 0x18);
        pvVar4 = mpp_frame_get_meta(frame);
        if (pvVar4 != (MppMeta)0x0) {
          mpp_meta_set_packet(pvVar4,KEY_INPUT_PACKET,packet);
        }
        if (((byte)mpp_debug & 2) != 0) {
          RVar9 = mpp_frame_get_pts(frame);
          _mpp_log_l(4,"mpp_dec","output frame pts %lld\n",(char *)0x0,RVar9);
        }
        pthread_mutex_lock(__mutex);
        mpp_list::add_at_tail((mpp_list *)&__mutex->__data,&frame,8);
        *(int *)((long)data + 0x28) = *(int *)((long)data + 0x28) + 1;
        pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
        pthread_mutex_unlock(__mutex);
        _mpp_port_enqueue("mpp_dec_advanced_thread",port,mpp_task);
        task.status.val = task.status.val & 0xfffffbff;
      }
      mpp_task = (MppTask)0x0;
      packet = (MppPacket)0x0;
      frame = (MppFrame)0x0;
      dec_task_info_init(&task.info);
      task.status.val = task.status.val & 0xfffffffd;
    }
  } while( true );
}

Assistant:

void *mpp_dec_advanced_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;
    MppThread *thd_dec  = dec->thread_parser;
    DecTask task;   /* decoder task */
    DecTask *pTask = &task;
    dec_task_init(pTask);
    HalDecTask  *task_dec = &pTask->info.dec;
    MppPort input  = mpp->mMppInPort;
    MppPort output = mpp->mMppOutPort;
    MppTask mpp_task = NULL;
    MPP_RET ret = MPP_OK;
    MppFrame frame = NULL;
    MppPacket packet = NULL;

    while (1) {
        {
            AutoMutex autolock(thd_dec->mutex());
            if (MPP_THREAD_RUNNING != thd_dec->get_status())
                break;

            if (check_task_wait(dec, &task))
                thd_dec->wait();
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        // 1. check task in
        dec_dbg_detail("mpp_pkt_in_rdy %d\n", task.status.mpp_pkt_in_rdy);
        if (!task.status.mpp_pkt_in_rdy) {
            ret = mpp_port_poll(input, MPP_POLL_NON_BLOCK);
            if (ret < 0) {
                task.wait.dec_pkt_in = 1;
                continue;
            }

            dec_dbg_detail("poll ready\n");

            task.status.mpp_pkt_in_rdy = 1;
            task.wait.dec_pkt_in = 0;

            ret = mpp_port_dequeue(input, &mpp_task);
            mpp_assert(ret == MPP_OK);
        }
        dec_dbg_detail("task in ready\n");

        mpp_assert(mpp_task);

        mpp_task_meta_get_packet(mpp_task, KEY_INPUT_PACKET, &packet);
        mpp_task_meta_get_frame (mpp_task, KEY_OUTPUT_FRAME,  &frame);

        if (!frame && packet) {
            MppMeta meta = mpp_packet_get_meta(packet);

            if (meta) {
                mpp_meta_get_frame(meta, KEY_OUTPUT_FRAME, &frame);
                if (frame)
                    task.status.mpp_in_frm_at_pkt = 1;
            }
        }

        if (NULL == packet || NULL == frame) {
            mpp_port_enqueue(input, mpp_task);
            task.status.mpp_pkt_in_rdy = 0;
            continue;
        }

        if (mpp_packet_get_buffer(packet)) {
            /*
             * if there is available buffer in the input packet do decoding
             */
            MppBuffer input_buffer = mpp_packet_get_buffer(packet);
            MppBuffer output_buffer = mpp_frame_get_buffer(frame);

            mpp_parser_prepare(dec->parser, packet, task_dec);

            /*
             * We may find eos in prepare step and there will be no anymore vaild task generated.
             * So here we try push eos task to hal, hal will push all frame to display then
             * push a eos frame to tell all frame decoded
             */
            if (task_dec->flags.eos && !task_dec->valid) {
                mpp_frame_set_eos(frame, 1);
                goto DEC_OUT;
            }

            /*
             *  look for a unused packet slot index
             */
            if (task_dec->input < 0) {
                mpp_buf_slot_get_unused(packet_slots, &task_dec->input);
            }
            mpp_buf_slot_set_prop(packet_slots, task_dec->input, SLOT_BUFFER, input_buffer);
            mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
            mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);

            ret = mpp_parser_parse(dec->parser, task_dec);
            if (ret != MPP_OK) {
                mpp_err_f("something wrong with mpp_parser_parse!\n");
                mpp_frame_set_errinfo(frame, 1); /* 0 - OK; 1 - error */
                mpp_buf_slot_clr_flag(packet_slots, task_dec->input,  SLOT_HAL_INPUT);
                goto DEC_OUT;
            }

            dec_dbg_detail("slot change %d\n", mpp_buf_slot_is_changed(frame_slots));
            if (mpp_buf_slot_is_changed(frame_slots)) {
                size_t slot_size = mpp_buf_slot_get_size(frame_slots);
                size_t buffer_size = mpp_buffer_get_size(output_buffer);

                dec_dbg_detail("change size required %d vs input %d\n", slot_size, buffer_size);
                if (slot_size == buffer_size) {
                    mpp_buf_slot_ready(frame_slots);
                }

                mpp_assert(slot_size <= buffer_size);

                if (slot_size > buffer_size) {
                    mpp_err_f("required buffer size %d is larger than input buffer size %d\n",
                              slot_size, buffer_size);
                }
            }

            mpp_buf_slot_set_prop(frame_slots, task_dec->output, SLOT_BUFFER, output_buffer);
            // update codec info
            if (!dec->info_updated && dec->dev) {
                MppFrame tmp = NULL;

                mpp_buf_slot_get_prop(frame_slots, task_dec->output, SLOT_FRAME_PTR, &tmp);
                update_dec_hal_info(dec, tmp);
                dec->info_updated = 1;
            }
            // register genertation
            mpp_hal_reg_gen(dec->hal, &pTask->info);
            mpp_hal_hw_start(dec->hal, &pTask->info);
            mpp_hal_hw_wait(dec->hal, &pTask->info);

            MppFrame tmp = NULL;
            mpp_buf_slot_get_prop(frame_slots, task_dec->output, SLOT_FRAME_PTR, &tmp);
            mpp_frame_set_width(frame, mpp_frame_get_width(tmp));
            mpp_frame_set_height(frame, mpp_frame_get_height(tmp));
            mpp_frame_set_hor_stride(frame, mpp_frame_get_hor_stride(tmp));
            mpp_frame_set_ver_stride(frame, mpp_frame_get_ver_stride(tmp));
            mpp_frame_set_hor_stride_pixel(frame, mpp_frame_get_hor_stride_pixel(tmp));
            mpp_frame_set_pts(frame, mpp_frame_get_pts(tmp));
            mpp_frame_set_fmt(frame, mpp_frame_get_fmt(tmp));
            mpp_frame_set_errinfo(frame, mpp_frame_get_errinfo(tmp));
            mpp_frame_set_buf_size(frame, mpp_frame_get_buf_size(tmp));

            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,  SLOT_HAL_INPUT);
            mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);
        } else {
            /*
             * else init a empty frame for output
             */
            mpp_log_f("line(%d): Error! Get no buffer from input packet\n", __LINE__);
            mpp_frame_init(&frame);
            mpp_frame_set_errinfo(frame, 1);
        }

        /*
         * first clear output packet
         * then enqueue task back to input port
         * final user will release the mpp_frame they had input
         */
    DEC_OUT:
        if (task.status.mpp_in_frm_at_pkt) {
            mpp_list *list = mpp->mFrmOut;
            MppMeta meta = mpp_frame_get_meta(frame);

            if (meta)
                mpp_meta_set_packet(meta, KEY_INPUT_PACKET, packet);

            mpp_dbg_pts("output frame pts %lld\n", mpp_frame_get_pts(frame));

            list->lock();
            list->add_at_tail(&frame, sizeof(frame));
            mpp->mFramePutCount++;
            list->signal();
            list->unlock();

            mpp_port_enqueue(input, mpp_task);
            mpp_task = NULL;

            task.status.mpp_in_frm_at_pkt = 0;
        } else {
            mpp_task_meta_set_packet(mpp_task, KEY_INPUT_PACKET, packet);
            mpp_port_enqueue(input, mpp_task);
            mpp_task = NULL;

            // send finished task to output port
            mpp_port_poll(output, MPP_POLL_BLOCK);
            mpp_port_dequeue(output, &mpp_task);
            mpp_task_meta_set_frame(mpp_task, KEY_OUTPUT_FRAME, frame);
            mpp_buffer_sync_ro_begin(mpp_frame_get_buffer(frame));

            // setup output task here
            mpp_port_enqueue(output, mpp_task);
            mpp_task = NULL;
        }

        packet = NULL;
        frame = NULL;

        dec_task_info_init(&pTask->info);

        task.status.mpp_pkt_in_rdy = 0;
    }

    // clear remain task in output port
    dec_release_task_in_port(input);
    dec_release_task_in_port(mpp->mUsrInPort);
    dec_release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}